

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

UTrie2 * utrie2_open_63(uint32_t initialValue,uint32_t errorValue,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UNewTrie2 *buffer;
  uint32_t *buffer_00;
  int local_40;
  int local_3c;
  int32_t j;
  int32_t i;
  uint32_t *data;
  UNewTrie2 *newTrie;
  UTrie2 *trie;
  UErrorCode *pErrorCode_local;
  uint32_t errorValue_local;
  uint32_t initialValue_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    _errorValue_local = (UTrie2 *)uprv_malloc_63(0x50);
    buffer = (UNewTrie2 *)uprv_malloc_63(0x453c0);
    buffer_00 = (uint32_t *)uprv_malloc_63(0x10000);
    if (((_errorValue_local == (UTrie2 *)0x0) || (buffer == (UNewTrie2 *)0x0)) ||
       (buffer_00 == (uint32_t *)0x0)) {
      uprv_free_63(_errorValue_local);
      uprv_free_63(buffer);
      uprv_free_63(buffer_00);
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      _errorValue_local = (UTrie2 *)0x0;
    }
    else {
      memset(_errorValue_local,0,0x50);
      _errorValue_local->initialValue = initialValue;
      _errorValue_local->errorValue = errorValue;
      _errorValue_local->highStart = 0x110000;
      _errorValue_local->newTrie = buffer;
      buffer->data = buffer_00;
      buffer->dataCapacity = 0x4000;
      buffer->initialValue = initialValue;
      buffer->errorValue = errorValue;
      buffer->highStart = 0x110000;
      buffer->firstFreeBlock = 0;
      buffer->isCompacted = '\0';
      for (local_3c = 0; local_3c < 0x80; local_3c = local_3c + 1) {
        buffer->data[local_3c] = initialValue;
      }
      for (; local_3c < 0xc0; local_3c = local_3c + 1) {
        buffer->data[local_3c] = errorValue;
      }
      for (local_3c = 0xc0; local_3c < 0x100; local_3c = local_3c + 1) {
        buffer->data[local_3c] = initialValue;
      }
      buffer->dataNullOffset = 0xc0;
      buffer->dataLength = 0x100;
      local_3c = 0;
      for (local_40 = 0; local_40 < 0x80; local_40 = local_40 + 0x20) {
        buffer->index2[local_3c] = local_40;
        buffer->map[local_3c] = 1;
        local_3c = local_3c + 1;
      }
      for (; local_40 < 0xc0; local_40 = local_40 + 0x20) {
        buffer->map[local_3c] = 0;
        local_3c = local_3c + 1;
      }
      buffer->map[local_3c] = 0x881d;
      while( true ) {
        local_3c = local_3c + 1;
        local_40 = local_40 + 0x20;
        if (0xff < local_40) break;
        buffer->map[local_3c] = 0;
      }
      for (local_3c = 4; local_3c < 0x820; local_3c = local_3c + 1) {
        buffer->index2[local_3c] = 0xc0;
      }
      for (local_3c = 0; local_3c < 0x240; local_3c = local_3c + 1) {
        buffer->index2[local_3c + 0x820] = -1;
      }
      for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 1) {
        buffer->index2[local_3c + 0xa60] = 0xc0;
      }
      buffer->index2NullOffset = 0xa60;
      buffer->index2Length = 0xaa0;
      local_40 = 0;
      for (local_3c = 0; local_3c < 0x20; local_3c = local_3c + 1) {
        buffer->index1[local_3c] = local_40;
        local_40 = local_40 + 0x40;
      }
      for (; local_3c < 0x220; local_3c = local_3c + 1) {
        buffer->index1[local_3c] = 0xa60;
      }
      for (local_3c = 0x80; local_3c < 0x800; local_3c = local_3c + 0x20) {
        utrie2_set32_63(_errorValue_local,local_3c,initialValue,pErrorCode);
      }
    }
  }
  else {
    _errorValue_local = (UTrie2 *)0x0;
  }
  return _errorValue_local;
}

Assistant:

U_CAPI UTrie2 * U_EXPORT2
utrie2_open(uint32_t initialValue, uint32_t errorValue, UErrorCode *pErrorCode) {
    UTrie2 *trie;
    UNewTrie2 *newTrie;
    uint32_t *data;
    int32_t i, j;

    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }

    trie=(UTrie2 *)uprv_malloc(sizeof(UTrie2));
    newTrie=(UNewTrie2 *)uprv_malloc(sizeof(UNewTrie2));
    data=(uint32_t *)uprv_malloc(UNEWTRIE2_INITIAL_DATA_LENGTH*4);
    if(trie==NULL || newTrie==NULL || data==NULL) {
        uprv_free(trie);
        uprv_free(newTrie);
        uprv_free(data);
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }

    uprv_memset(trie, 0, sizeof(UTrie2));
    trie->initialValue=initialValue;
    trie->errorValue=errorValue;
    trie->highStart=0x110000;
    trie->newTrie=newTrie;
#ifdef UTRIE2_DEBUG
    trie->name="open";
#endif

    newTrie->data=data;
#ifdef UCPTRIE_DEBUG
    newTrie->t3=umutablecptrie_open(initialValue, errorValue, pErrorCode);
#endif
    newTrie->dataCapacity=UNEWTRIE2_INITIAL_DATA_LENGTH;
    newTrie->initialValue=initialValue;
    newTrie->errorValue=errorValue;
    newTrie->highStart=0x110000;
    newTrie->firstFreeBlock=0;  /* no free block in the list */
    newTrie->isCompacted=FALSE;

    /*
     * preallocate and reset
     * - ASCII
     * - the bad-UTF-8-data block
     * - the null data block
     */
    for(i=0; i<0x80; ++i) {
        newTrie->data[i]=initialValue;
    }
    for(; i<0xc0; ++i) {
        newTrie->data[i]=errorValue;
    }
    for(i=UNEWTRIE2_DATA_NULL_OFFSET; i<UNEWTRIE2_DATA_START_OFFSET; ++i) {
        newTrie->data[i]=initialValue;
    }
    newTrie->dataNullOffset=UNEWTRIE2_DATA_NULL_OFFSET;
    newTrie->dataLength=UNEWTRIE2_DATA_START_OFFSET;

    /* set the index-2 indexes for the 2=0x80>>UTRIE2_SHIFT_2 ASCII data blocks */
    for(i=0, j=0; j<0x80; ++i, j+=UTRIE2_DATA_BLOCK_LENGTH) {
        newTrie->index2[i]=j;
        newTrie->map[i]=1;
    }
    /* reference counts for the bad-UTF-8-data block */
    for(; j<0xc0; ++i, j+=UTRIE2_DATA_BLOCK_LENGTH) {
        newTrie->map[i]=0;
    }
    /*
     * Reference counts for the null data block: all blocks except for the ASCII blocks.
     * Plus 1 so that we don't drop this block during compaction.
     * Plus as many as needed for lead surrogate code points.
     */
    /* i==newTrie->dataNullOffset */
    newTrie->map[i++]=
        (0x110000>>UTRIE2_SHIFT_2)-
        (0x80>>UTRIE2_SHIFT_2)+
        1+
        UTRIE2_LSCP_INDEX_2_LENGTH;
    j+=UTRIE2_DATA_BLOCK_LENGTH;
    for(; j<UNEWTRIE2_DATA_START_OFFSET; ++i, j+=UTRIE2_DATA_BLOCK_LENGTH) {
        newTrie->map[i]=0;
    }

    /*
     * set the remaining indexes in the BMP index-2 block
     * to the null data block
     */
    for(i=0x80>>UTRIE2_SHIFT_2; i<UTRIE2_INDEX_2_BMP_LENGTH; ++i) {
        newTrie->index2[i]=UNEWTRIE2_DATA_NULL_OFFSET;
    }

    /*
     * Fill the index gap with impossible values so that compaction
     * does not overlap other index-2 blocks with the gap.
     */
    for(i=0; i<UNEWTRIE2_INDEX_GAP_LENGTH; ++i) {
        newTrie->index2[UNEWTRIE2_INDEX_GAP_OFFSET+i]=-1;
    }

    /* set the indexes in the null index-2 block */
    for(i=0; i<UTRIE2_INDEX_2_BLOCK_LENGTH; ++i) {
        newTrie->index2[UNEWTRIE2_INDEX_2_NULL_OFFSET+i]=UNEWTRIE2_DATA_NULL_OFFSET;
    }
    newTrie->index2NullOffset=UNEWTRIE2_INDEX_2_NULL_OFFSET;
    newTrie->index2Length=UNEWTRIE2_INDEX_2_START_OFFSET;

    /* set the index-1 indexes for the linear index-2 block */
    for(i=0, j=0;
        i<UTRIE2_OMITTED_BMP_INDEX_1_LENGTH;
        ++i, j+=UTRIE2_INDEX_2_BLOCK_LENGTH
    ) {
        newTrie->index1[i]=j;
    }

    /* set the remaining index-1 indexes to the null index-2 block */
    for(; i<UNEWTRIE2_INDEX_1_LENGTH; ++i) {
        newTrie->index1[i]=UNEWTRIE2_INDEX_2_NULL_OFFSET;
    }

    /*
     * Preallocate and reset data for U+0080..U+07ff,
     * for 2-byte UTF-8 which will be compacted in 64-blocks
     * even if UTRIE2_DATA_BLOCK_LENGTH is smaller.
     */
    for(i=0x80; i<0x800; i+=UTRIE2_DATA_BLOCK_LENGTH) {
        utrie2_set32(trie, i, initialValue, pErrorCode);
    }

    return trie;
}